

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

void weffects(obj *obj,schar dx,schar dy,schar dz)

{
  byte bVar1;
  boolean bVar2;
  int oindx;
  int iVar3;
  boolean local_19;
  boolean was_unkn;
  boolean disclose;
  int otyp;
  schar dz_local;
  schar dy_local;
  schar dx_local;
  obj *obj_local;
  
  oindx = (int)obj->otyp;
  local_19 = '\0';
  bVar1 = objects[oindx].field_0x10;
  exercise(2,'\x01');
  if (((((u.usteed == (monst *)0x0) || ((*(ushort *)&objects[oindx].field_0x11 >> 2 & 3) == 1)) ||
       (dx != '\0')) || ((dy != '\0' || (dz < '\x01')))) || (bVar2 = zap_steed(obj), bVar2 == '\0'))
  {
    if ((*(ushort *)&objects[oindx].field_0x11 >> 2 & 3) == 2) {
      obj_zapped = '\0';
      if ((u._1052_1_ & 1) == 0) {
        if (dz == '\0') {
          iVar3 = rn2(8);
          beam_hit((int)dx,(int)dy,iVar3 + 6,0,bhitm,bhito,obj,(boolean *)0x0);
        }
        else {
          local_19 = zap_updown(obj,dz);
        }
      }
      else {
        bhitm(u.ustuck,obj);
      }
      if (obj_zapped != '\0') {
        pline("You feel shuddering vibrations.");
      }
    }
    else if ((*(ushort *)&objects[oindx].field_0x11 >> 2 & 3) == 1) {
      zapnodir(obj);
    }
    else {
      if ((oindx == 0x1cf) || (oindx == 0x17d)) {
        zap_dig(dx,dy,dz);
      }
      else if ((oindx < 0x17e) || (0x182 < oindx)) {
        if ((oindx < 0x1d0) || (0x1d5 < oindx)) {
          warning("weffects: unexpected spell or wand");
        }
        else {
          iVar3 = 6;
          if (oindx == 0x1d0) {
            iVar3 = 2;
          }
          buzz(oindx + -0x1d0,iVar3,u.ux,u.uy,(int)dx,(int)dy);
        }
      }
      else {
        buzz(oindx + -0x174,u.ulevel / 2 + 1,u.ux,u.uy,(int)dx,(int)dy);
      }
      local_19 = '\x01';
    }
  }
  else {
    local_19 = '\x01';
  }
  if ((local_19 != '\0') && ((bVar1 & 1) == 0)) {
    discover_object(oindx,'\x01','\x01');
    more_experienced(0,0,10);
  }
  return;
}

Assistant:

void weffects(struct obj *obj, schar dx, schar dy, schar dz)
{
	int otyp = obj->otyp;
	boolean disclose = FALSE, was_unkn = !objects[otyp].oc_name_known;

	exercise(A_WIS, TRUE);
	if (u.usteed && (objects[otyp].oc_dir != NODIR) &&
	    !dx && !dy && (dz > 0) && zap_steed(obj)) {
		disclose = TRUE;
	} else if (objects[otyp].oc_dir == IMMEDIATE) {
	    obj_zapped = FALSE;

	    if (u.uswallow) {
		bhitm(u.ustuck, obj);
		/* [how about `bhitpile(u.ustuck->minvent)' effect?] */
	    } else if (dz) {
		disclose = zap_updown(obj, dz);
	    } else {
		beam_hit(dx, dy, rn1(8,6), ZAPPED_WAND, bhitm, bhito, obj, NULL);
	    }
	    /* give a clue if obj_zapped */
	    if (obj_zapped)
		pline("You feel shuddering vibrations.");

	} else if (objects[otyp].oc_dir == NODIR) {
	    zapnodir(obj);

	} else {
	    /* neither immediate nor directionless */

	    if (otyp == WAN_DIGGING || otyp == SPE_DIG)
		zap_dig(dx, dy, dz);
	    else if (otyp >= SPE_MAGIC_MISSILE && otyp <= SPE_FINGER_OF_DEATH)
		buzz(otyp - SPE_MAGIC_MISSILE + 10,
		     u.ulevel / 2 + 1,
		     u.ux, u.uy, dx, dy);
	    else if (otyp >= WAN_MAGIC_MISSILE && otyp <= WAN_LIGHTNING)
		buzz(otyp - WAN_MAGIC_MISSILE,
		     (otyp == WAN_MAGIC_MISSILE) ? 2 : 6,
		     u.ux, u.uy, dx, dy);
	    else
		warning("weffects: unexpected spell or wand");
	    disclose = TRUE;
	}
	if (disclose && was_unkn) {
	    makeknown(otyp);
	    more_experienced(0, 0, 10);
	}
	return;
}